

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

bool helics::apps::addPotentialTargetVariations
               (ConnectionsList *connections,string *interfaceName,string *targetFieldName1,
               string *targetFieldName2,json *interface)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  json *in_stack_00000008;
  string *in_stack_00000010;
  string *in_stack_00000018;
  ConnectionsList *in_stack_00000020;
  bool found;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined1 local_29;
  
  std::operator+(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
  std::operator+(in_stack_fffffffffffffee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  local_29 = addPotentialTargets(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                 in_stack_00000008);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  if (!local_29) {
    std::operator+(in_RSI,in_RDI);
    local_29 = addPotentialTargets(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                   in_stack_00000008);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    in_stack_ffffffffffffff00 = in_RDI;
    in_stack_ffffffffffffff08 = in_RSI;
  }
  if (local_29 == false) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    iVar2 = toupper((int)*pvVar3);
    vVar1 = (value_type)iVar2;
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(vVar1,in_stack_fffffffffffffee0));
    *pvVar3 = vVar1;
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    addPotentialTargets(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(vVar1,in_stack_fffffffffffffee0));
  }
  return local_29;
}

Assistant:

static bool addPotentialTargetVariations(ConnectionsList& connections,
                                         const std::string& interfaceName,
                                         const std::string& targetFieldName1,
                                         std::string targetFieldName2,
                                         const nlohmann::json& interface)
{
    bool found = addPotentialTargets(connections,
                                     interfaceName,
                                     targetFieldName1 + "_" + targetFieldName2,
                                     interface);
    if (!found) {
        found = addPotentialTargets(connections,
                                    interfaceName,
                                    targetFieldName1 + targetFieldName2,
                                    interface);
    }
    if (!found) {
        targetFieldName2.front() = std::toupper(targetFieldName2.front());
        addPotentialTargets(connections,
                            interfaceName,
                            targetFieldName1 + targetFieldName2,
                            interface);
    }
    return found;
}